

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmMove7<(moira::Instr)71,(moira::Mode)2,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  Ea<(moira::Mode)7,_4> dst;
  Ea<(moira::Mode)2,_4> src;
  u32 local_30;
  ushort local_2c;
  uint local_28;
  u32 local_1c;
  ushort local_18;
  
  local_18 = op & 7;
  local_30 = *addr;
  local_2c = op >> 9 & 7;
  *addr = local_30 + 2;
  local_1c = local_30;
  local_28 = (*this->_vptr_Moira[6])();
  local_28 = local_28 & 0xffff;
  cVar3 = 'm';
  lVar5 = 0;
  do {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar3;
    cVar3 = "fdmove"[lVar5 + 3];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  pcVar4 = str->ptr;
  SVar1 = str->style->syntax;
  str->ptr = pcVar4 + 1;
  if (2 < SVar1 - MOIRA_MIT) {
    *pcVar4 = '.';
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
  }
  *pcVar4 = 'l';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    pcVar4 = str->ptr;
    do {
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
      pcVar4 = str->ptr;
    } while (pcVar4 < str->base + iVar2);
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)2,_4> *)&local_1c);
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)7,_4> *)&local_30);
  return;
}

Assistant:

void
Moira::dasmMove7(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <Mode::AW,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}